

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_ecc.c
# Opt level: O1

void tc_uECC_vli_mmod(tc_uECC_word_t *result,tc_uECC_word_t *product,tc_uECC_word_t *mod,
                     wordcount_t num_words)

{
  uint uVar1;
  tc_uECC_word_t *ptVar2;
  byte bVar3;
  ushort uVar4;
  int iVar5;
  undefined7 in_register_00000009;
  uint uVar6;
  tc_uECC_word_t *ptVar7;
  ulong uVar8;
  tc_uECC_word_t *end;
  uint uVar9;
  uint uVar10;
  char cVar11;
  int iVar12;
  short sVar13;
  int iVar14;
  int iVar15;
  tc_uECC_word_t atStack_2a8 [114];
  tc_uECC_word_t tmp [16];
  tc_uECC_word_t mod_multiple [16];
  tc_uECC_word_t *v [2];
  
  v[0] = product;
  uVar4 = tc_uECC_vli_numBits(mod,num_words);
  iVar14 = (int)CONCAT71(in_register_00000009,num_words);
  iVar15 = iVar14 * 0x40 - (uint)uVar4;
  sVar13 = (short)iVar15;
  iVar12 = (int)sVar13;
  iVar5 = iVar12 + 0x1f;
  if (-1 < sVar13) {
    iVar5 = iVar12;
  }
  cVar11 = (char)(iVar5 >> 5);
  if ('\0' < cVar11) {
    memset(tmp + 0xe,0,(ulong)((iVar5 >> 5 & 0x7fU) << 2));
  }
  if (iVar12 % 0x20 < 1) {
    if ('\0' < num_words) {
      memcpy(tmp + (long)cVar11 + 0xe,mod,(ulong)(byte)num_words << 2);
    }
  }
  else if (num_words != '\0') {
    bVar3 = (byte)(iVar12 % 0x20);
    uVar8 = 0;
    uVar9 = 0;
    do {
      uVar10 = mod[uVar8] << (bVar3 & 0x1f) | uVar9;
      uVar9 = mod[uVar8] >> (0x20 - bVar3 & 0x1f);
      tmp[(ulong)(uint)((int)cVar11 + (int)uVar8) + 0xe] = uVar10;
      uVar8 = uVar8 + 1;
    } while ((CONCAT71(in_register_00000009,num_words) & 0xffffffff) != uVar8);
  }
  if (sVar13 < 0) {
    uVar8 = 1;
  }
  else {
    v[1] = (tc_uECC_word_t *)(long)(iVar14 + -1);
    uVar8 = 1;
    do {
      uVar9 = (uint)uVar8;
      if (num_words < '\x01') {
        uVar10 = 0;
      }
      else {
        ptVar7 = v[uVar8 - 1];
        ptVar2 = v[(ulong)(uVar9 ^ 1) - 1];
        cVar11 = '\0';
        uVar10 = 0;
        do {
          uVar6 = tmp[(long)cVar11 + 0xe] + uVar10;
          if (uVar6 != 0) {
            uVar10 = (uint)(ptVar7[cVar11] < uVar6);
          }
          ptVar2[cVar11] = ptVar7[cVar11] - uVar6;
          cVar11 = cVar11 + '\x01';
        } while ((int)cVar11 < iVar14 * 2);
      }
      if (num_words < '\x01') {
        tmp[(long)v[1] + 0xe] = tmp[(long)v[1] + 0xe] | tmp[(long)num_words + 0xe] << 0x1f;
      }
      else {
        uVar6 = 0;
        ptVar7 = tmp + (ulong)(byte)num_words + 0xe;
        do {
          uVar1 = ptVar7[-1];
          ptVar7[-1] = uVar1 >> 1 | uVar6;
          ptVar7 = ptVar7 + -1;
          uVar6 = uVar1 << 0x1f;
        } while (tmp + 0xe < ptVar7);
        tmp[(long)v[1] + 0xe] = tmp[(long)v[1] + 0xe] | tmp[(long)num_words + 0xe] << 0x1f;
        if ('\0' < num_words) {
          uVar6 = 0;
          ptVar7 = tmp + (long)num_words + 0xe + (byte)num_words;
          do {
            uVar1 = ptVar7[-1];
            ptVar7[-1] = uVar1 >> 1 | uVar6;
            ptVar7 = ptVar7 + -1;
            uVar6 = uVar1 << 0x1f;
          } while (tmp + (long)num_words + 0xe < ptVar7);
        }
      }
      uVar8 = (ulong)(uVar9 == uVar10);
      sVar13 = (short)iVar15;
      iVar15 = iVar15 + -1;
    } while (0 < sVar13);
    uVar8 = (ulong)(uVar9 == uVar10);
  }
  if ('\0' < num_words) {
    ptVar7 = v[uVar8 - 1];
    uVar8 = 0;
    do {
      result[uVar8] = ptVar7[uVar8];
      uVar8 = uVar8 + 1;
    } while ((byte)num_words != uVar8);
  }
  return;
}

Assistant:

void tc_uECC_vli_mmod(tc_uECC_word_t *result, tc_uECC_word_t *product,
    		   const tc_uECC_word_t *mod, wordcount_t num_words)
{
	tc_uECC_word_t mod_multiple[2 * NUM_ECC_WORDS];
	tc_uECC_word_t tmp[2 * NUM_ECC_WORDS];
	tc_uECC_word_t *v[2] = {tmp, product};
	tc_uECC_word_t index;

	/* Shift mod so its highest set bit is at the maximum position. */
	bitcount_t shift = (num_words * 2 * tc_uECC_WORD_BITS) -
			   tc_uECC_vli_numBits(mod, num_words);
	wordcount_t word_shift = shift / tc_uECC_WORD_BITS;
	wordcount_t bit_shift = shift % tc_uECC_WORD_BITS;
	tc_uECC_word_t carry = 0;
	tc_uECC_vli_clear(mod_multiple, word_shift);
	if (bit_shift > 0) {
		for(index = 0; index < (tc_uECC_word_t)num_words; ++index) {
			mod_multiple[word_shift + index] = (mod[index] << bit_shift) | carry;
			carry = mod[index] >> (tc_uECC_WORD_BITS - bit_shift);
		}
	} else {
		tc_uECC_vli_set(mod_multiple + word_shift, mod, num_words);
	}

	for (index = 1; shift >= 0; --shift) {
		tc_uECC_word_t borrow = 0;
		wordcount_t i;
		for (i = 0; i < num_words * 2; ++i) {
			tc_uECC_word_t diff = v[index][i] - mod_multiple[i] - borrow;
			if (diff != v[index][i]) {
				borrow = (diff > v[index][i]);
			}
			v[1 - index][i] = diff;
		}
		/* Swap the index if there was no borrow */
		index = !(index ^ borrow);
		tc_uECC_vli_rshift1(mod_multiple, num_words);
		mod_multiple[num_words - 1] |= mod_multiple[num_words] <<
					       (tc_uECC_WORD_BITS - 1);
		tc_uECC_vli_rshift1(mod_multiple + num_words, num_words);
	}
	tc_uECC_vli_set(result, v[index], num_words);
}